

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

int isValid733Integer(uchar *p)

{
  bool local_11;
  uchar *p_local;
  
  local_11 = false;
  if (((*p == p[7]) && (local_11 = false, p[1] == p[6])) && (local_11 = false, p[2] == p[5])) {
    local_11 = p[3] == p[4];
  }
  return (int)local_11;
}

Assistant:

static int
isValid733Integer(const unsigned char *p)
{
	return (p[0] == p[7]
		&& p[1] == p[6]
		&& p[2] == p[5]
		&& p[3] == p[4]);
}